

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

string * sqlite_orm::internal::to_string_abi_cxx11_(journal_mode j)

{
  int iVar1;
  char in_DIL;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [20];
  allocator<char> local_11;
  string *local_10;
  char local_1;
  
  local_1 = in_DIL;
  if (to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_);
    if (iVar1 != 0) {
      local_10 = to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_,"DELETE",
                 &local_11);
      local_10 = (string *)0x366df0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_ + 1),
                 "TRUNCATE",local_25);
      local_10 = (string *)0x366e10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_ + 2),
                 "PERSIST",&local_26);
      local_10 = (string *)0x366e30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_ + 3),
                 "MEMORY",&local_27);
      local_10 = (string *)0x366e50;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_ + 4),
                 "WAL",&local_28);
      local_10 = (string *)0x366e70;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_ + 5),
                 "OFF",&local_29);
      std::allocator<char>::~allocator(&local_29);
      std::allocator<char>::~allocator(&local_28);
      std::allocator<char>::~allocator(&local_27);
      std::allocator<char>::~allocator(&local_26);
      std::allocator<char>::~allocator(local_25);
      std::allocator<char>::~allocator(&local_11);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_);
    }
  }
  return to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_ + (int)local_1;
}

Assistant:

inline const std::string &to_string(journal_mode j) {
    static std::string res[] = {
        "DELETE",
        "TRUNCATE",
        "PERSIST",
        "MEMORY",
        "WAL",
        "OFF",
    };
    return res[static_cast<int>(j)];
}